

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::BlobProto::BlobProto(BlobProto *this,BlobProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  BlobShape *this_01;
  BlobProto *from_local;
  BlobProto *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobProto_00d4d8a0
  ;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->data_,&from->data_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->diff_,&from->diff_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_data_,&from->double_data_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_diff_,&from->double_diff_);
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  bVar1 = has_shape(from);
  if (bVar1) {
    this_01 = (BlobShape *)operator_new(0x30);
    BlobShape::BlobShape(this_01,from->shape_);
    this->shape_ = this_01;
  }
  else {
    this->shape_ = (BlobShape *)0x0;
  }
  memcpy(&this->num_,&from->num_,0x10);
  return;
}

Assistant:

BlobProto::BlobProto(const BlobProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      data_(from.data_),
      diff_(from.diff_),
      double_data_(from.double_data_),
      double_diff_(from.double_diff_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_shape()) {
    shape_ = new ::caffe::BlobShape(*from.shape_);
  } else {
    shape_ = NULL;
  }
  ::memcpy(&num_, &from.num_,
    reinterpret_cast<char*>(&width_) -
    reinterpret_cast<char*>(&num_) + sizeof(width_));
  // @@protoc_insertion_point(copy_constructor:caffe.BlobProto)
}